

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O3

Gia_Man_t * Gia_ManInterOneInt(Gia_Man_t *pCof1,Gia_Man_t *pCof0,int Depth)

{
  int *piVar1;
  undefined8 uVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  Gia_Man_t *pGVar6;
  void *__s;
  ulong uVar7;
  Gia_Man_t *pGVar8;
  Gia_Man_t *p;
  Gia_Man_t **ppGVar9;
  bool bVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  Gia_Man_t **ppGVar15;
  Gia_Obj_t *pGVar16;
  long lVar17;
  uint uVar18;
  Gia_Man_t *pCof [2] [2];
  Gia_Man_t *local_88;
  Gia_Man_t *pGStack_80;
  Gia_Man_t *local_78 [3];
  ulong local_60;
  Gia_Man_t *local_58 [2];
  Gia_Man_t *local_48;
  Gia_Man_t **local_40;
  Gia_Man_t *local_38;
  
  local_78[0] = (Gia_Man_t *)0x0;
  local_78[1] = (Gia_Man_t *)0x0;
  local_88 = (Gia_Man_t *)0x0;
  pGStack_80 = (Gia_Man_t *)0x0;
  if (pCof1->nObjs == pCof1->vCis->nSize + pCof1->vCos->nSize + 1) {
LAB_0039e163:
    pGVar6 = Gia_ManDup(pCof1);
    return pGVar6;
  }
  iVar13 = pCof0->vCis->nSize;
  if (pCof0->nObjs == pCof0->vCos->nSize + iVar13 + 1) goto LAB_0039e163;
  iVar5 = 0x10;
  if (0xe < iVar13 - 1U) {
    iVar5 = iVar13;
  }
  if (iVar5 == 0) {
    __s = (void *)0x0;
  }
  else {
    __s = malloc((long)iVar5 << 2);
    if (__s == (void *)0x0) {
      __s = (void *)0x0;
    }
    else {
      memset(__s,0,(long)iVar13 * 4);
    }
  }
  pGVar6 = pCof0;
  bVar3 = true;
  do {
    bVar10 = bVar3;
    if ((0 < pGVar6->nObjs) && (pGVar16 = pGVar6->pObjs, pGVar16 != (Gia_Obj_t *)0x0)) {
      lVar17 = 0;
      do {
        uVar7 = *(ulong *)pGVar16;
        if ((uVar7 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar7) {
          uVar2 = *(undefined8 *)
                   ((long)pGVar16 + (ulong)(uint)((int)(uVar7 & 0x1fffffff) << 2) * -3);
          if (((uint)uVar2 & 0x9fffffff) == 0x9fffffff) {
            uVar4 = (uint)((ulong)uVar2 >> 0x20);
            if (iVar13 <= (int)(uVar4 & 0x1fffffff)) goto LAB_0039e576;
            piVar1 = (int *)((long)__s + (ulong)(uVar4 & 0x1fffffff) * 4);
            *piVar1 = *piVar1 + 1;
            uVar7 = *(ulong *)pGVar16;
          }
          uVar2 = *(undefined8 *)((long)pGVar16 + (ulong)((uint)(uVar7 >> 0x1e) & 0x7ffffffc) * -3);
          if (((uint)uVar2 & 0x9fffffff) == 0x9fffffff) {
            uVar4 = (uint)((ulong)uVar2 >> 0x20);
            if (iVar13 <= (int)(uVar4 & 0x1fffffff)) {
LAB_0039e576:
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                            ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
            }
            piVar1 = (int *)((long)__s + (ulong)(uVar4 & 0x1fffffff) * 4);
            *piVar1 = *piVar1 + 1;
          }
        }
        lVar17 = lVar17 + 1;
        pGVar16 = pGVar16 + 1;
      } while (lVar17 < pGVar6->nObjs);
    }
    pGVar6 = pCof1;
    bVar3 = false;
  } while (bVar10);
  if (iVar13 < 1) {
    iVar13 = -1;
    iVar5 = -1;
    if (__s == (void *)0x0) goto LAB_0039e2f7;
  }
  else {
    uVar7 = 0;
    uVar14 = 0xffffffff;
    iVar11 = 0;
    do {
      iVar5 = *(int *)((long)__s + uVar7 * 4);
      iVar12 = iVar11;
      if (iVar11 <= iVar5) {
        iVar12 = iVar5;
      }
      if (iVar11 < iVar5) {
        uVar14 = uVar7 & 0xffffffff;
      }
      uVar7 = uVar7 + 1;
      iVar11 = iVar12;
      iVar5 = (int)uVar14;
    } while ((long)iVar13 != uVar7);
  }
  iVar13 = iVar5;
  free(__s);
LAB_0039e2f7:
  uVar4 = 8 - Depth;
  uVar18 = 0;
  ppGVar9 = &local_88;
  ppGVar15 = &pGStack_80;
  local_60 = (ulong)(uint)Depth;
  local_48 = pCof1;
  bVar3 = true;
  do {
    bVar10 = bVar3;
    local_40 = ppGVar15;
    pGVar6 = Gia_ManDupCofactorVar(pCof0,iVar13,0);
    pGVar8 = Acb_NtkEcoSynthesize(pGVar6);
    *ppGVar9 = pGVar8;
    Gia_ManStop(pGVar6);
    printf("%*sCof%d%d : ",(ulong)uVar4,"",(ulong)uVar18,0);
    pGVar6 = local_48;
    Gia_ManPrintStats(pGVar8,(Gps_Par_t *)0x0);
    pGVar8 = Gia_ManDupCofactorVar(pCof0,iVar13,1);
    p = Acb_NtkEcoSynthesize(pGVar8);
    *local_40 = p;
    Gia_ManStop(pGVar8);
    printf("%*sCof%d%d : ",(ulong)uVar4,"",(ulong)uVar18);
    Gia_ManPrintStats(p,(Gps_Par_t *)0x0);
    ppGVar9 = local_78;
    ppGVar15 = local_78 + 1;
    uVar18 = 1;
    pCof0 = pGVar6;
    bVar3 = false;
  } while (bVar10);
  iVar5 = (int)local_60;
  ppGVar9 = &local_88;
  ppGVar15 = local_58;
  lVar17 = 0;
  bVar3 = true;
  do {
    bVar10 = bVar3;
    pGVar6 = local_78[lVar17];
    if ((pGVar6->nObjs == pGVar6->vCis->nSize + pGVar6->vCos->nSize + 1) ||
       (pGVar8 = *ppGVar9, pGVar8->nObjs == pGVar8->vCis->nSize + pGVar8->vCos->nSize + 1)) {
      pGVar6 = Gia_ManDup(pGVar6);
    }
    else if ((int)local_60 == 1) {
      pGVar6 = Gia_ManInterOne(pGVar6,pGVar8,1);
    }
    else {
      pGVar6 = Gia_ManInterOneInt(pGVar6,pGVar8,iVar5 + -1);
    }
    printf("%*sInter%d : ",(ulong)uVar4,"",lVar17);
    Gia_ManPrintStats(pGVar6,(Gps_Par_t *)0x0);
    pGVar8 = Abc_GiaSynthesizeInter(pGVar6);
    *ppGVar15 = pGVar8;
    Gia_ManStop(pGVar6);
    printf("%*sInter%d : ",(ulong)uVar4,"",lVar17);
    Gia_ManPrintStats(pGVar8,(Gps_Par_t *)0x0);
    lVar17 = 1;
    ppGVar15 = &local_38;
    ppGVar9 = &pGStack_80;
    bVar3 = false;
  } while (bVar10);
  Gia_ManStop(local_88);
  Gia_ManStop(pGStack_80);
  Gia_ManStop(local_78[0]);
  Gia_ManStop(local_78[1]);
  pGVar6 = Gia_ManDupMux(iVar13,local_38,local_58[0]);
  Gia_ManStop(local_58[0]);
  Gia_ManStop(local_38);
  return pGVar6;
}

Assistant:

Gia_Man_t * Gia_ManInterOneInt( Gia_Man_t * pCof1, Gia_Man_t * pCof0, int Depth )
{
    extern Gia_Man_t * Gia_ManInterOne( Gia_Man_t * pNtkOn, Gia_Man_t * pNtkOff, int fVerbose );
    extern Gia_Man_t * Abc_GiaSynthesizeInter( Gia_Man_t * p );
    Gia_Man_t * pGia[2] = { pCof0, pCof1 };
    Gia_Man_t * pCof[2][2] = {{0}}, * pTemp;
    Gia_Man_t * pInter[2], * pFinal;
    Gia_Obj_t * pObj; 
    int i, n, m, Count, CountBest = 0, iVarBest = -1;
    // find PIs with the highest fanout
    Vec_Int_t * vFanCount;
    if ( Gia_ManAndNum(pCof1) == 0 || Gia_ManAndNum(pCof0) == 0 )
        return Gia_ManDup(pCof1);
    vFanCount = Vec_IntStart( Gia_ManCiNum(pCof0) );
    for ( n = 0; n < 2; n++ )
    {
        Gia_ManForEachAnd( pGia[n], pObj, i )
        {
            if ( Gia_ObjIsCi(Gia_ObjFanin0(pObj)) )
                Vec_IntAddToEntry( vFanCount, Gia_ObjCioId(Gia_ObjFanin0(pObj)), 1 );
            if ( Gia_ObjIsCi(Gia_ObjFanin1(pObj)) )
                Vec_IntAddToEntry( vFanCount, Gia_ObjCioId(Gia_ObjFanin1(pObj)), 1 );
        }
    }
    Vec_IntForEachEntry( vFanCount, Count, i )
        if ( CountBest < Count )
        {
            CountBest = Count;
            iVarBest = i;
        }
    Vec_IntFree( vFanCount );
    // Gia_Man_t * Gia_ManDupCofactorVar( Gia_Man_t * p, int iVar, int Value )
    for ( n = 0; n < 2; n++ )
    for ( m = 0; m < 2; m++ )
    {
        pCof[n][m] = Gia_ManDupCofactorVar( pGia[n], iVarBest, m );
        pCof[n][m] = Acb_NtkEcoSynthesize( pTemp = pCof[n][m] );
        Gia_ManStop( pTemp );
        printf( "%*sCof%d%d : ", 8-Depth, "", n, m );
        Gia_ManPrintStats( pCof[n][m], NULL );
    }
    for ( m = 0; m < 2; m++ )
    {
        if ( Gia_ManAndNum(pCof[1][m]) == 0 || Gia_ManAndNum(pCof[0][m]) == 0 )
            pInter[m] = Gia_ManDup( pCof[1][m] );
        else if ( Depth == 1 )
            pInter[m] = Gia_ManInterOne( pCof[1][m], pCof[0][m], 1 );
        else
            pInter[m] = Gia_ManInterOneInt( pCof[1][m], pCof[0][m], Depth-1 );
        printf( "%*sInter%d : ", 8-Depth, "", m );
        Gia_ManPrintStats( pInter[m], NULL );
        pInter[m] = Abc_GiaSynthesizeInter( pTemp = pInter[m] );
        Gia_ManStop( pTemp );
        printf( "%*sInter%d : ", 8-Depth, "", m );
        Gia_ManPrintStats( pInter[m], NULL );
    }
    for ( n = 0; n < 2; n++ )
    for ( m = 0; m < 2; m++ )
        Gia_ManStop( pCof[n][m] );
    pFinal = Gia_ManDupMux( iVarBest, pInter[1], pInter[0] );
    for ( m = 0; m < 2; m++ )
        Gia_ManStop( pInter[m] );
    return pFinal;
}